

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_actions.hpp
# Opt level: O3

void create(string *__title,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__optional_params)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  _Base_ptr extraout_RAX;
  iterator iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  size_type *psVar11;
  char *__format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  string *psVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Rb_tree_header *p_Var16;
  string __file_name;
  string full_iso_date_string;
  string iso_date_string;
  string _output_path;
  frontmatter __file;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  undefined1 local_4d8 [8];
  undefined1 auStack_4d0 [40];
  string local_4a8;
  undefined1 local_488 [32];
  _Base_ptr local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [32];
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _frontmatter local_128;
  
  uVar4 = (uint)unaff_RBP;
  local_220._24_8_ = local_220 + 8;
  local_220._8_4_ = _S_red;
  local_220._16_8_ = (_Base_ptr)0x0;
  local_220._40_8_ = 0;
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_148._M_p = (pointer)&local_138;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  local_420._0_8_ = local_420 + 0x10;
  local_420._8_8_ = 0;
  local_420[0x10] = '\0';
  __format = (char *)local_420._0_8_;
  local_220._32_8_ = local_220._24_8_;
  if ((__optional_params->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var6 = (__optional_params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_488._0_8_ = local_488 + 0x10;
    local_488._8_8_ = 0;
    local_488[0x10] = '\0';
    __format = local_440 + 0x10;
    local_440._8_8_ = 0;
    local_440[0x10] = '\0';
    p_Var16 = &(__optional_params->_M_t)._M_impl.super__Rb_tree_header;
    local_440._0_8_ = __format;
    if ((_Rb_tree_header *)p_Var6 != p_Var16) {
      unaff_RBP = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
      local_468 = (_Base_ptr)__title;
      do {
        std::__cxx11::string::_M_assign((string *)local_488);
        std::__cxx11::string::_M_assign((string *)unaff_RBP);
        iVar3 = std::__cxx11::string::compare((char *)local_488);
        if (iVar3 == 0) {
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a0,local_440._0_8_,
                     (char *)(local_440._0_8_ + local_440._8_8_));
          bVar2 = util::is_not_valid_fm_format(&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          psVar12 = (string *)&local_1e8;
          if (bVar2) goto LAB_0010b3dc;
LAB_0010b46a:
          std::__cxx11::string::_M_assign(psVar12);
        }
        else {
LAB_0010b3dc:
          iVar3 = std::__cxx11::string::compare((char *)local_488);
          psVar12 = (string *)local_420;
          if (iVar3 == 0) goto LAB_0010b46a;
          if (*(char *)local_488._0_8_ == '%') {
            local_4e8 = (undefined1  [8])local_4d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4e8,local_488._0_8_,
                       (char *)(local_488._0_8_ + local_488._8_8_));
            std::__cxx11::string::append(local_4e8);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_4e8,(long)local_4e0._M_p);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_488,unaff_RBP);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_220,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_4e8);
            if ((undefined1 *)auStack_4d0._8_8_ != auStack_4d0 + 0x18) {
              operator_delete((void *)auStack_4d0._8_8_,auStack_4d0._24_8_ + 1);
            }
          }
          if (local_4e8 != (undefined1  [8])local_4d8) {
            operator_delete((void *)local_4e8,(long)local_4d8 + 1);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        __title = (string *)local_468;
      } while ((_Rb_tree_header *)p_Var6 != p_Var16);
      if ((_Base_ptr)local_440._0_8_ != (_Base_ptr)(local_440 + 0x10)) {
        operator_delete((void *)local_440._0_8_,CONCAT71(local_440._17_7_,local_440[0x10]) + 1);
      }
    }
    uVar4 = (uint)unaff_RBP;
    if ((_Base_ptr)local_488._0_8_ != (_Base_ptr)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
    }
  }
  p_Var13 = (_Base_ptr)(local_220 + 8);
  if (((_Base_ptr)__title)->_M_parent < (_Base_ptr)0x41) {
    local_4e8 = (undefined1  [8])local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"date","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_220,(key_type *)local_4e8);
    sVar1 = pmVar9->_M_string_length;
    if (local_4e8 != (undefined1  [8])local_4d8) {
      operator_delete((void *)local_4e8,(long)local_4d8 + 1);
    }
    uVar4 = 0;
    if (sVar1 != 0) {
      local_4e8 = (undefined1  [8])local_4d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"date","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_220,(key_type *)local_4e8);
      uVar4 = std::__cxx11::stoi(pmVar9,(size_t *)0x0,10);
      if (local_4e8 != (undefined1  [8])local_4d8) {
        operator_delete((void *)local_4e8,(long)local_4d8 + 1);
      }
    }
    if (local_1e0 == 0) {
      __format = "YAML";
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x11f10b);
    }
    if (local_420._8_8_ == 0) {
      std::__cxx11::string::operator=((string *)local_420,"./");
    }
    local_4e8 = (undefined1  [8])local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"layout","");
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_220,(key_type *)local_4e8);
    if (local_4e8 != (undefined1  [8])local_4d8) {
      operator_delete((void *)local_4e8,(long)local_4d8 + 1);
    }
    if (iVar8._M_node != p_Var13) goto LAB_0010b6a0;
    paVar15 = &local_2c0.field_2;
    local_2c0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c0,"What is the post layout in the frontmatter?","");
    util::prompt((string *)local_488,&local_2c0,0xffff);
    p_Var14 = (_Base_ptr)auStack_4d0;
    local_4e8 = (undefined1  [8])0x11fb7e;
    __format = local_488 + 0x10;
    local_468 = (_Base_ptr)__title;
    if ((char *)local_488._0_8_ != __format) goto LAB_0010b60d;
    auStack_4d0._0_8_ = CONCAT71(local_488._17_7_,local_488[0x10]);
    auStack_4d0._8_8_ = local_488._24_8_;
    local_4e0._M_p = (pointer)p_Var14;
  }
  else {
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_488 + 0x10);
    local_488._0_8_ = paVar15;
    std::__cxx11::string::_M_construct((ulong)local_488,'\x02');
    *(undefined2 *)local_488._0_8_ = 0x3436;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_488,0,(char *)0x0,0x11fb4f);
    local_4e8 = (undefined1  [8])*plVar5;
    psVar11 = (size_type *)(plVar5 + 2);
    if (local_4e8 == (undefined1  [8])psVar11) {
      local_4d8 = (undefined1  [8])*psVar11;
      auStack_4d0._0_8_ = plVar5[3];
      local_4e8 = (undefined1  [8])local_4d8;
    }
    else {
      local_4d8 = (undefined1  [8])*psVar11;
    }
    local_4e0._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_4e8);
    p_Var13 = (_Base_ptr)(local_240 + 0x10);
    local_240._0_8_ = *puVar7;
    __format = (char *)(puVar7 + 2);
    if ((char *)local_240._0_8_ == __format) {
      local_240._16_8_ = *(undefined8 *)__format;
      local_240._24_8_ = puVar7[3];
      local_240._0_8_ = p_Var13;
    }
    else {
      local_240._16_8_ = *(undefined8 *)__format;
    }
    local_240._8_8_ = puVar7[1];
    *puVar7 = __format;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    exit_error_code(10,(string *)local_240);
    local_488._0_8_ = extraout_RAX;
    p_Var14 = (_Base_ptr)__title;
LAB_0010b60d:
    auStack_4d0._0_8_ = CONCAT71(local_488._17_7_,local_488[0x10]);
    local_4e0._M_p = (pointer)(_Base_ptr)local_488._0_8_;
  }
  local_4d8 = (undefined1  [8])local_488._8_8_;
  local_488._8_8_ = 0;
  local_488[0x10] = '\0';
  local_488._0_8_ = __format;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4e8);
  if ((_Base_ptr)local_4e0._M_p != p_Var14) {
    operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
  }
  __title = (string *)local_468;
  if ((_Base_ptr)local_488._0_8_ != (_Base_ptr)(local_488 + 0x10)) {
    operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
LAB_0010b6a0:
  local_4e8 = (undefined1  [8])local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"author","");
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_220,(key_type *)local_4e8);
  if (local_4e8 != (undefined1  [8])local_4d8) {
    operator_delete((void *)local_4e8,(long)local_4d8 + 1);
  }
  if (iVar8._M_node == p_Var13) {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,"Who is the author in the post?","");
    util::prompt((string *)local_488,&local_2e0,0xffff);
    local_4e8 = (undefined1  [8])0x11fbb1;
    p_Var13 = (_Base_ptr)(local_488 + 0x10);
    if ((_Base_ptr)local_488._0_8_ == p_Var13) {
      auStack_4d0._8_8_ = local_488._24_8_;
      local_4e0._M_p = (pointer)auStack_4d0;
    }
    else {
      local_4e0._M_p = (pointer)local_488._0_8_;
    }
    auStack_4d0._1_7_ = local_488._17_7_;
    auStack_4d0[0] = local_488[0x10];
    local_4d8 = (undefined1  [8])local_488._8_8_;
    local_488._8_8_ = 0;
    local_488[0x10] = '\0';
    local_488._0_8_ = p_Var13;
    local_468 = (_Base_ptr)__title;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_220,
               (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4e8);
    if ((_Base_ptr)local_4e0._M_p != (_Base_ptr)auStack_4d0) {
      operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
    }
    if ((_Base_ptr)local_488._0_8_ != p_Var13) {
      operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
    }
    __title = (string *)local_468;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      __title = (string *)local_468;
    }
  }
  util::get_current_formatted_date_string_abi_cxx11_
            ((string *)local_488,(util *)(ulong)uVar4,0x11fbd7,__format);
  local_4e8 = (undefined1  [8])local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"date","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_220,(key_type *)local_4e8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if (local_4e8 != (undefined1  [8])local_4d8) {
    operator_delete((void *)local_4e8,(long)local_4d8 + 1);
  }
  util::get_current_formatted_date_string_abi_cxx11_
            ((string *)local_440,(util *)(ulong)uVar4,0x11fbe0,__format);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,local_420._0_8_,(char *)(local_420._0_8_ + local_420._8_8_));
  util::check_dir_path((string *)local_4e8,&local_300);
  std::__cxx11::string::operator=((string *)local_420,(string *)local_4e8);
  if (local_4e8 != (undefined1  [8])local_4d8) {
    operator_delete((void *)local_4e8,(long)local_4d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,"How many categories for this post?","");
  local_220._48_4_ = util::prompt_int(&local_320,1,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Categories","");
  util::prompt_arr(&local_4a8,&local_340,local_220._48_4_);
  local_4e8 = (undefined1  [8])0x11fc06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p == &local_4a8.field_2) {
    auStack_4d0._8_8_ = local_4a8.field_2._8_8_;
    local_4e0._M_p = (pointer)auStack_4d0;
  }
  else {
    local_4e0._M_p = local_4a8._M_dataplus._M_p;
  }
  auStack_4d0._0_8_ = local_4a8.field_2._M_allocated_capacity;
  local_4d8 = (undefined1  [8])local_4a8._M_string_length;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity =
       local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_4d0) {
    operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  local_4e8 = (undefined1  [8])0x11f67c;
  local_4e0._M_p = (pointer)auStack_4d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,local_488._0_8_,(char *)(local_488._0_8_ + local_488._8_8_));
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_4d0) {
    operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_360,"How many tags for this post?","");
  local_220._52_4_ = util::prompt_int(&local_360,1,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Tags","");
  util::prompt_arr(&local_4a8,&local_380,local_220._52_4_);
  local_4e8 = (undefined1  [8])0x11fc39;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p == &local_4a8.field_2) {
    auStack_4d0._8_8_ = local_4a8.field_2._8_8_;
    local_4e0._M_p = (pointer)auStack_4d0;
  }
  else {
    local_4e0._M_p = local_4a8._M_dataplus._M_p;
  }
  auStack_4d0._0_8_ = local_4a8.field_2._M_allocated_capacity;
  local_4d8 = (undefined1  [8])local_4a8._M_string_length;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity =
       local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_4d0) {
    operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  local_4e8 = (undefined1  [8])0x11fc43;
  local_4e0._M_p = (pointer)auStack_4d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,*(long *)__title,
             (long)&((_Base_ptr)__title)->_M_parent->_M_color + *(long *)__title);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_4d0) {
    operator_delete(local_4e0._M_p,auStack_4d0._0_8_ + 1);
  }
  std::operator+(&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_460._M_dataplus._M_p = (pointer)*plVar5;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_460._M_dataplus._M_p == psVar11) {
    local_460.field_2._M_allocated_capacity = *psVar11;
    local_460.field_2._8_4_ = (undefined4)plVar5[3];
    local_460.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  }
  else {
    local_460.field_2._M_allocated_capacity = *psVar11;
  }
  local_460._M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a0,*(long *)__title,
             (long)&((_Base_ptr)__title)->_M_parent->_M_color + *(long *)__title);
  util::slugize_str(&local_280,&local_3a0);
  std::operator+(&local_4a8,&local_460,&local_280);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  local_4e8 = (undefined1  [8])*plVar5;
  psVar11 = (size_type *)(plVar5 + 2);
  if (local_4e8 == (undefined1  [8])psVar11) {
    local_4d8 = (undefined1  [8])*psVar11;
    auStack_4d0._0_8_ = plVar5[3];
    local_4e8 = (undefined1  [8])local_4d8;
  }
  else {
    local_4d8 = (undefined1  [8])*psVar11;
  }
  local_4e0._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,local_4e8,local_4e0._M_p + (long)local_4e8);
  _frontmatter::_frontmatter(&local_128,(_frontmatter *)local_220);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,local_1e8._M_p,local_1e8._M_p + local_1e0);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"write","");
  file_io::post_fm_write(&local_3c0,&local_128,&local_3e0,&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  _frontmatter::~_frontmatter(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_460,"\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_4a8._M_dataplus._M_p = (pointer)*plVar5;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_4a8._M_dataplus._M_p == psVar11) {
    local_4a8.field_2._M_allocated_capacity = *psVar11;
    local_4a8.field_2._8_8_ = plVar5[3];
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  }
  else {
    local_4a8.field_2._M_allocated_capacity = *psVar11;
  }
  local_4a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar10);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_460);
  exit(0);
}

Assistant:

void create(std::string __title, std::map<std::string, std::string> __optional_params) {
	frontmatter __file;
	std::string _output_path;

	// parsing through the options (--OPTION=VALUE)
	if (!__optional_params.empty()) {
		std::map<std::string, std::string>::iterator _trav = __optional_params.begin();

		std::string _key, _value;
		while (_trav != __optional_params.end()) {
			_key = _trav->first;
			_value = _trav->second;

			if (_key == FM_TYPE && !util::is_not_valid_fm_format(_value)) {
				__file.type = _value;
				_trav++;
				continue;
			}
			else if (_key == OUTPUT_PATH) {
				_output_path = _value;
				_trav++;
				continue;
			}
			else if (_key.front() == '%') {
				std::cout << _key + " is not an optional command parameter." << std::endl;
				_trav++;
				continue;
			}

			__file.list.insert(std::make_pair(_key, _value));
			_trav++;
		}
	}

    if (__title.length() > MAX_TITLE_LENGTH) {
        exit_error_code(10, "Title exceeds character limit of " + std::to_string(MAX_TITLE_LENGTH) +  " characters.");
	}
	
	// default parameters for the publish date
	int publish_date;
	if (__file.list["date"].empty())
		publish_date = 0;
	else
		publish_date = stoi(__file.list["date"]);
	
	// default parameters for the frontmatter format
	if (__file.type.empty())
		__file.type = "YAML";
	
	// default parameters for the path
	if (_output_path.empty())
		_output_path = "./";

	// prompting for layout when no given option
	if (__file.list.find("layout") == __file.list.end())
		__file.list.insert(std::make_pair("layout", util::prompt("What is the post layout in the frontmatter?")));

	// prompting for author when no given option
	if (__file.list.find("author") == __file.list.end())
		__file.list.insert(std::make_pair("author", util::prompt("Who is the author in the post?") ) );

	std::string full_iso_date_string = util::get_current_formatted_date_string(publish_date);
	__file.list.at("date") = full_iso_date_string;

	std::string iso_date_string = util::get_current_formatted_date_string(publish_date, "%F");
	_output_path = util::check_dir_path(_output_path);
	// Filling up the frontmatter with the necessary data
	
	__file.categories_length = util::prompt_int("How many categories for this post?", 1, MAX_ARR_LENGTH);
	__file.list.insert(std::make_pair("categories", util::prompt_arr("Categories", __file.categories_length) ));

	__file.list.insert(std::make_pair("date", full_iso_date_string));

	__file.tags_length = util::prompt_int("How many tags for this post?", 1, MAX_ARR_LENGTH);
	__file.list.insert(std::make_pair("tags", util::prompt_arr("Tags", __file.tags_length)));

	__file.list.insert(std::make_pair("title", __title));
	
    std::string __file_name = _output_path + iso_date_string + "-" + util::slugize_str(__title) + ".md";

	int _exit_code = file_io::post_fm_write(__file_name, __file, __file.type);
	if (_exit_code == 0)
		std::cout << "\n" + __file_name + " successfully created." << std::endl;
	exit(_exit_code);
}